

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_filename.c
# Opt level: O1

int64_t file_seek(archive *a,void *client_data,int64_t request,wchar_t whence)

{
  int iVar1;
  __off_t _Var2;
  int *piVar3;
  char *fmt;
  
  _Var2 = lseek(*client_data,request,whence);
  if (-1 < _Var2) {
    return _Var2;
  }
  iVar1 = *(int *)((long)client_data + 0x20);
  piVar3 = __errno_location();
  if (iVar1 == 1) {
    fmt = "Error seeking in \'%s\'";
  }
  else {
    if (iVar1 == 0) {
      archive_set_error(a,*piVar3,"Error seeking in stdin");
      return -0x1e;
    }
    fmt = "Error seeking in \'%ls\'";
  }
  archive_set_error(a,*piVar3,fmt,(long)client_data + 0x24);
  return -0x1e;
}

Assistant:

static int64_t
file_seek(struct archive *a, void *client_data, int64_t request, int whence)
{
	struct read_file_data *mine = (struct read_file_data *)client_data;
	int64_t r;

	/* We use off_t here because lseek() is declared that way. */
	/* See above for notes about when off_t is less than 64 bits. */
	r = lseek(mine->fd, request, whence);
	if (r >= 0)
		return r;

	/* If the input is corrupted or truncated, fail. */
	if (mine->filename_type == FNT_STDIN)
		archive_set_error(a, errno, "Error seeking in stdin");
	else if (mine->filename_type == FNT_MBS)
		archive_set_error(a, errno, "Error seeking in '%s'",
		    mine->filename.m);
	else
		archive_set_error(a, errno, "Error seeking in '%ls'",
		    mine->filename.w);
	return (ARCHIVE_FATAL);
}